

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::piece_picker::inc_refcount
          (piece_picker *this,piece_index_t index,torrent_peer *peer)

{
  piece_pos *this_00;
  int priority;
  int iVar1;
  
  this_00 = (this->m_piece_map).
            super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
            .
            super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
            ._M_impl.super__Vector_impl_data._M_start + index.m_val;
  priority = piece_pos::priority(this_00,this);
  *(uint *)this_00 = *(uint *)this_00 & 0xfc000000 | *(uint *)this_00 + 1 & 0x3ffffff;
  if (this->m_dirty == false) {
    iVar1 = piece_pos::priority(this_00,this);
    if (priority != iVar1) {
      if (priority != -1) {
        update(this,priority,(prio_index_t)(this_00->index).m_val);
        return;
      }
      add(this,index);
      return;
    }
  }
  return;
}

Assistant:

void piece_picker::inc_refcount(piece_index_t const index
		, const aux::torrent_peer* peer)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "inc_refcount(" << index << ")" << std::endl;
#endif
		piece_pos& p = m_piece_map[index];

#ifdef TORRENT_DEBUG_REFCOUNTS
		TORRENT_ASSERT(p.have_peers.count(peer) == 0);
		p.have_peers.insert(peer);
#else
		TORRENT_UNUSED(peer);
#endif

		int prev_priority = p.priority(this);
		++p.peer_count;
		if (m_dirty) return;
		int new_priority = p.priority(this);
		if (prev_priority == new_priority) return;
		if (prev_priority == -1)
			add(index);
		else
			update(prev_priority, p.index);
	}